

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::BoxRenderer::ConvertRenderValue
          (string *__return_storage_ptr__,BoxRenderer *this,string *input)

{
  char cVar1;
  uint __val;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar2 = 0;
  do {
    if (input->_M_string_length <= uVar2) {
      return __return_storage_ptr__;
    }
    __val = (uint)(byte)(input->_M_dataplus)._M_p[uVar2];
    if (0x1f < __val) goto LAB_01340495;
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    cVar1 = (input->_M_dataplus)._M_p[uVar2];
    switch(cVar1) {
    case '\a':
      break;
    case '\b':
      break;
    case '\t':
      break;
    case '\n':
      break;
    case '\v':
      break;
    case '\f':
      break;
    case '\r':
      break;
    default:
      if (cVar1 == '\x1b') break;
      ::std::__cxx11::to_string(&local_50,__val);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_50);
      goto LAB_013404a1;
    }
LAB_01340495:
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_013404a1:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

string BoxRenderer::ConvertRenderValue(const string &input) {
	string result;
	result.reserve(input.size());
	for (idx_t c = 0; c < input.size(); c++) {
		data_t byte_value = const_data_ptr_cast(input.c_str())[c];
		if (byte_value < 32) {
			// ASCII control character
			result += "\\";
			switch (input[c]) {
			case 7:
				// bell
				result += 'a';
				break;
			case 8:
				// backspace
				result += 'b';
				break;
			case 9:
				// tab
				result += 't';
				break;
			case 10:
				// newline
				result += 'n';
				break;
			case 11:
				// vertical tab
				result += 'v';
				break;
			case 12:
				// form feed
				result += 'f';
				break;
			case 13:
				// cariage return
				result += 'r';
				break;
			case 27:
				// escape
				result += 'e';
				break;
			default:
				result += to_string(byte_value);
				break;
			}
		} else {
			result += input[c];
		}
	}
	return result;
}